

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode verify_header(Curl_easy *data)

{
  char *__s;
  size_t __n;
  void *pvVar1;
  char *ptr;
  size_t hlen;
  char *header;
  SingleRequest *k;
  Curl_easy *data_local;
  
  __s = Curl_dyn_ptr(&(data->state).headerb);
  __n = Curl_dyn_len(&(data->state).headerb);
  pvVar1 = memchr(__s,0,__n);
  if (pvVar1 == (void *)0x0) {
    if ((data->req).headerline < 2) {
      data_local._4_4_ = CURLE_OK;
    }
    else if ((((*__s == ' ') || (*__s == '\t')) && (2 < (data->req).headerline)) ||
            (pvVar1 = memchr(__s,0x3a,__n), pvVar1 != (void *)0x0)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data,"Header without colon");
      data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Nul byte in header");
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode verify_header(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  const char *header = Curl_dyn_ptr(&data->state.headerb);
  size_t hlen = Curl_dyn_len(&data->state.headerb);
  char *ptr = memchr(header, 0x00, hlen);
  if(ptr) {
    /* this is bad, bail out */
    failf(data, "Nul byte in header");
    return CURLE_WEIRD_SERVER_REPLY;
  }
  if(k->headerline < 2)
    /* the first "header" is the status-line and it has no colon */
    return CURLE_OK;
  if(((header[0] == ' ') || (header[0] == '\t')) && k->headerline > 2)
    /* line folding, can't happen on line 2 */
    ;
  else {
    ptr = memchr(header, ':', hlen);
    if(!ptr) {
      /* this is bad, bail out */
      failf(data, "Header without colon");
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }
  return CURLE_OK;
}